

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

BasicBlock * __thiscall
spvtools::opt::LoopPeeling::CreateBlockBefore(LoopPeeling *this,BasicBlock *bb)

{
  pointer *ppuVar1;
  IRContext *pIVar2;
  LoopDescriptor *pLVar3;
  ulong uVar4;
  mapped_type pBVar5;
  pointer pOVar6;
  uint **ppuVar7;
  Function *pFVar8;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var9;
  PodType *pPVar10;
  BasicBlock *pBVar11;
  LoopPeeling *pLVar12;
  __node_base _Var13;
  bool bVar14;
  char cVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar18;
  Instruction *pIVar19;
  _Hash_node_base *p_Var20;
  mapped_type *ppLVar21;
  mapped_type *ppBVar22;
  mapped_type *ppBVar23;
  uint **ppuVar24;
  ulong uVar25;
  __node_base_ptr p_Var26;
  __node_base_ptr p_Var27;
  ulong uVar28;
  Operand *operand;
  pointer pOVar29;
  Instruction *pIVar30;
  Loop *this_00;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar31;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_bb;
  string message;
  size_type __dnew;
  Function *local_b0;
  undefined1 local_a8 [32];
  BasicBlock *local_88;
  BasicBlock *local_80;
  IRContext *local_78;
  Instruction *local_70;
  spv_position_t local_68;
  code *pcStack_50;
  LoopPeeling *local_40;
  __node_base local_38;
  
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  local_38._M_nxt =
       (_Hash_node_base *)
       (pIVar2->def_use_mgr_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  pIVar2 = (IRContext *)
           (pIVar2->cfg_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
           super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar19 = (bb->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar16 = 0;
  if (pIVar19->has_result_id_ == true) {
    uVar16 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
  }
  local_80 = bb;
  local_78 = pIVar2;
  pvVar18 = CFG::preds((CFG *)pIVar2,uVar16);
  if ((long)(pvVar18->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar18->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    __assert_fail("cfg.preds(bb->id()).size() == 1 && \"More than one predecessor\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x15d,"BasicBlock *spvtools::opt::LoopPeeling::CreateBlockBefore(BasicBlock *)");
  }
  pIVar19 = (Instruction *)operator_new(0x70);
  pIVar2 = this->context_;
  local_40 = this;
  uVar16 = Module::TakeNextIdBound
                     ((pIVar2->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((uVar16 == 0) && ((pIVar2->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_a8._0_8_ = (long)local_a8 + 0x10;
    local_68.line = 0x25;
    local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)&local_68);
    local_a8._16_8_ = local_68.line;
    *(undefined8 *)local_a8._0_8_ = 0x667265766f204449;
    ((OperandData *)(local_a8._0_8_ + 8))->_vptr_SmallVector = (_func_int **)0x797254202e776f6c;
    *(undefined8 *)(local_a8._0_8_ + 0x10) = 0x676e696e6e757220;
    pPVar10 = (PodType *)(local_a8._0_8_ + 0x18);
    builtin_strncpy((pPVar10->data)._M_elems," com",4);
    pPVar10[1].data._M_elems[0] = 'p';
    pPVar10[1].data._M_elems[1] = 'a';
    pPVar10[1].data._M_elems[2] = 'c';
    pPVar10[1].data._M_elems[3] = 't';
    *(undefined8 *)(local_a8._0_8_ + 0x1d) = 0x2e7364692d746361;
    local_a8._8_8_ = local_68.line;
    *(char *)((long)&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_68.line)->
                     _vptr_IntrusiveNodeBase + local_a8._0_8_) = '\0';
    local_68.line = 0;
    local_68.column = 0;
    local_68.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar2->consumer_,SPV_MSG_ERROR,"",&local_68,(char *)local_a8._0_8_);
    if (local_a8._0_8_ != (long)local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,
                      (ulong)((long)&((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                                     local_a8._16_8_)->_vptr_IntrusiveNodeBase + 1));
    }
  }
  local_a8._0_8_ =
       (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  local_a8._8_8_ = (pointer)0x0;
  uVar28 = 0;
  local_a8._16_8_ = (Instruction *)0x0;
  Instruction::Instruction
            (pIVar19,pIVar2,OpLabel,0,uVar16,
             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_a8);
  local_b0 = (Function *)operator_new(0x88);
  (local_b0->def_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
     *)&(local_b0->params_).
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl = pIVar19;
  ppuVar1 = &(local_b0->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
  _vptr_IntrusiveList = (_func_int **)0x0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase = (_func_int **)0x0;
  (local_b0->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__Instruction_00b15d30;
  *(undefined4 *)
   &(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    context_ = 0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
  *(undefined8 *)
   ((long)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ + 6) = 0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  opcode_ = OpNop;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  has_type_id_ = false;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  has_result_id_ = false;
  *(undefined2 *)
   &(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    field_0x2e = 0;
  *(undefined8 *)
   &(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    unique_id_ = 0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
  _vptr_IntrusiveList = (_func_int **)ppuVar1;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)ppuVar1;
  *(bool *)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = true;
  (local_b0->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&PTR__InstructionList_00b15dc8;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_a8);
  pLVar12 = local_40;
  pBVar11 = local_80;
  pLVar3 = (local_40->loop_utils_).loop_desc_;
  pIVar19 = (local_80->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar19->has_result_id_ == true) {
    uVar16 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
    uVar28 = (ulong)uVar16;
  }
  uVar4 = (pLVar3->basic_block_to_loop_)._M_h._M_bucket_count;
  uVar25 = uVar28 % uVar4;
  p_Var26 = (pLVar3->basic_block_to_loop_)._M_h._M_buckets[uVar25];
  p_Var27 = (__node_base_ptr)0x0;
  if ((p_Var26 != (__node_base_ptr)0x0) &&
     (p_Var20 = p_Var26->_M_nxt, p_Var27 = p_Var26,
     *(uint *)&p_Var26->_M_nxt[1]._M_nxt != (uint)uVar28)) {
    while (p_Var26 = p_Var20, p_Var20 = p_Var26->_M_nxt, p_Var20 != (_Hash_node_base *)0x0) {
      p_Var27 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var20[1]._M_nxt % uVar4 != uVar25) ||
         (p_Var27 = p_Var26, *(uint *)&p_Var20[1]._M_nxt == (uint)uVar28)) goto LAB_005b13c3;
    }
    p_Var27 = (__node_base_ptr)0x0;
  }
LAB_005b13c3:
  if (p_Var27 == (__node_base_ptr)0x0) {
    p_Var20 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var20 = p_Var27->_M_nxt;
  }
  if (p_Var20 == (_Hash_node_base *)0x0) {
    this_00 = (Loop *)0x0;
  }
  else {
    this_00 = (Loop *)p_Var20[2]._M_nxt;
  }
  if (this_00 != (Loop *)0x0) {
    Loop::AddBasicBlock(this_00,(BasicBlock *)local_b0);
    pLVar3 = (pLVar12->loop_utils_).loop_desc_;
    pIVar19 = (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&(local_b0->params_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
              super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl;
    uVar16 = 0;
    if (pIVar19->has_result_id_ == true) {
      uVar16 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
    }
    local_a8._0_4_ = uVar16;
    ppLVar21 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pLVar3->basic_block_to_loop_,(key_type *)local_a8);
    *ppLVar21 = this_00;
  }
  pFVar8 = local_b0;
  pIVar2 = pLVar12->context_;
  local_a8._0_8_ =
       (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          *)&(local_b0->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
       super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl;
  if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    ppBVar22 = std::__detail::
               _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pIVar2->instr_to_block_,(key_type *)local_a8);
    *ppBVar22 = (mapped_type)pFVar8;
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((DefUseManager *)local_38._M_nxt,
             (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                *)&(local_b0->params_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
             super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl);
  pIVar2 = local_78;
  pIVar19 = (pBVar11->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar16 = 0;
  if (pIVar19->has_result_id_ == true) {
    uVar16 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
  }
  pvVar18 = CFG::preds((CFG *)pIVar2,uVar16);
  local_a8._0_4_ =
       *(pvVar18->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start;
  ppBVar23 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&(pIVar2->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (key_type *)local_a8);
  pBVar5 = *ppBVar23;
  pIVar19 = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar19 != (Instruction *)0x0) &&
     ((pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    pIVar19 = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    local_68.line = (size_t)pBVar11;
    local_68.column = (size_t)&local_b0;
    pcStack_50 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:366:32)>
                 ::_M_invoke;
    local_68.index =
         (size_t)std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:366:32)>
                 ::_M_manager;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._24_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
         ::_M_invoke;
    local_a8._16_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
         ::_M_manager;
    pOVar29 = (pIVar19->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pOVar6 = (pIVar19->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_a8._0_8_ = (Instruction *)&local_68;
    if (pOVar29 != pOVar6) {
      do {
        bVar14 = spvIsInIdType(pOVar29->type);
        if (bVar14) {
          ppuVar7 = (uint **)(pOVar29->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar24 = &(pOVar29->words).small_data_;
          if (ppuVar7 != (uint **)0x0) {
            ppuVar24 = ppuVar7;
          }
          local_70 = (Instruction *)*ppuVar24;
          if ((Instruction *)local_a8._16_8_ == (Instruction *)0x0) goto LAB_005b1898;
          cVar15 = (*(code *)local_a8._24_8_)(local_a8,&local_70);
          if (cVar15 == '\0') break;
        }
        pOVar29 = pOVar29 + 1;
      } while (pOVar29 != pOVar6);
    }
    if ((Instruction *)local_a8._16_8_ != (Instruction *)0x0) {
      (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
    }
    if ((Instruction *)local_68.index != (Instruction *)0x0) {
      (*(code *)local_68.index)(&local_68,&local_68,3);
    }
    pIVar2 = local_78;
    pIVar19 = (pBVar5->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar17 = 0;
    uVar16 = 0;
    if (pIVar19->has_result_id_ == true) {
      uVar16 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
    }
    pIVar19 = (local_80->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar19->has_result_id_ == true) {
      uVar17 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
    }
    CFG::RemoveEdge((CFG *)pIVar2,uVar16,uVar17);
    pIVar19 = (pBVar5->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar17 = 0;
    uVar16 = 0;
    if (pIVar19->has_result_id_ == true) {
      uVar16 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
    }
    pIVar19 = (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&(local_b0->params_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
              super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl;
    if (pIVar19->has_result_id_ == true) {
      uVar17 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
    }
    CFG::AddEdge((CFG *)pIVar2,uVar16,uVar17);
    _Var13._M_nxt = local_38._M_nxt;
    pIVar19 = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar19 != (Instruction *)0x0) &&
       ((pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      analysis::DefUseManager::AnalyzeInstUse
                ((DefUseManager *)local_38._M_nxt,
                 (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
      pBVar11 = local_80;
      local_68.line = (size_t)&local_b0;
      local_68.column = (size_t)_Var13._M_nxt;
      pcStack_50 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:376:22)>
                   ::_M_invoke;
      local_68.index =
           (size_t)std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:376:22)>
                   ::_M_manager;
      local_a8._8_8_ = (pointer)0x0;
      local_a8._24_8_ =
           std::
           _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
           ::_M_invoke;
      local_a8._16_8_ =
           std::
           _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
           ::_M_manager;
      pIVar19 = (local_80->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      local_a8._0_8_ = (Instruction *)&local_68;
      if ((pIVar19 != (Instruction *)0x0) &&
         ((pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
        do {
          if (pIVar19 == (Instruction *)0x0) break;
          pIVar30 = (pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          cVar15 = '\0';
          if ((pIVar30->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
          {
            pIVar30 = (Instruction *)0x0;
          }
          if (pIVar19->opcode_ == OpPhi) {
            local_70 = pIVar19;
            if ((Instruction *)local_a8._16_8_ == (Instruction *)0x0) {
LAB_005b1898:
              std::__throw_bad_function_call();
            }
            cVar15 = (*(code *)local_a8._24_8_)(local_a8,&local_70);
            if (cVar15 != '\0') {
              pIVar19 = pIVar30;
            }
          }
        } while (cVar15 != '\0');
      }
      if ((Instruction *)local_a8._16_8_ != (Instruction *)0x0) {
        (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
      }
      pLVar12 = local_40;
      pIVar2 = local_78;
      if ((Instruction *)local_68.index != (Instruction *)0x0) {
        (*(code *)local_68.index)(&local_68,&local_68,3);
      }
      local_a8._0_8_ = pLVar12->context_;
      local_a8._8_8_ = local_b0;
      local_a8._16_8_ =
           &(local_b0->params_).
            super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8._24_4_ = 4.2039e-45;
      pIVar19 = (pBVar11->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar17 = 0;
      uVar16 = 0;
      if (pIVar19->has_result_id_ == true) {
        uVar16 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
      }
      InstructionBuilder::AddBranch((InstructionBuilder *)local_a8,uVar16);
      CFG::RegisterBlock((CFG *)pIVar2,(BasicBlock *)local_b0);
      pFVar8 = (pLVar12->loop_utils_).function_;
      pIVar19 = (local_80->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar19->has_result_id_ == true) {
        uVar17 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
      }
      UVar31 = std::
               __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                         (&pFVar8->blocks_,
                          (pFVar8->blocks_).
                          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,&pFVar8->blocks_,
                          (pFVar8->blocks_).
                          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,uVar17);
      pFVar8 = local_b0;
      _Var9._M_head_impl = (Instruction *)(pLVar12->loop_utils_).function_;
      if ((UVar31.container_ ==
           (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            *)((long)(_Var9._M_head_impl + 1) + 0x28U)) &&
         ((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
          UVar31.iterator_._M_current == *(pointer *)((long)(_Var9._M_head_impl + 1) + 0x30))) {
        __assert_fail("it != loop_utils_.GetFunction()->end() && \"Basic block not found in the function.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                      ,0x185,
                      "BasicBlock *spvtools::opt::LoopPeeling::CreateBlockBefore(BasicBlock *)");
      }
      local_b0 = (Function *)0x0;
      (pFVar8->def_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = _Var9._M_head_impl;
      local_a8._0_8_ = pFVar8;
      local_88 = (BasicBlock *)0x0;
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ::_M_insert_rval(UVar31.container_,
                       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)UVar31.iterator_._M_current,(value_type *)local_a8);
      if ((Instruction *)local_a8._0_8_ != (Instruction *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)local_a8,
                   (BasicBlock *)local_a8._0_8_);
      }
      if (local_88 != (BasicBlock *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)&local_88,local_88);
      }
      local_88 = (BasicBlock *)0x0;
      if (local_b0 != (Function *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)&local_b0,(BasicBlock *)local_b0);
      }
      return (BasicBlock *)pFVar8;
    }
  }
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
}

Assistant:

BasicBlock* LoopPeeling::CreateBlockBefore(BasicBlock* bb) {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();
  CFG& cfg = *context_->cfg();
  assert(cfg.preds(bb->id()).size() == 1 && "More than one predecessor");

  // TODO(1841): Handle id overflow.
  std::unique_ptr<BasicBlock> new_bb =
      MakeUnique<BasicBlock>(std::unique_ptr<Instruction>(new Instruction(
          context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})));
  // Update the loop descriptor.
  Loop* in_loop = (*loop_utils_.GetLoopDescriptor())[bb];
  if (in_loop) {
    in_loop->AddBasicBlock(new_bb.get());
    loop_utils_.GetLoopDescriptor()->SetBasicBlockToLoop(new_bb->id(), in_loop);
  }

  context_->set_instr_block(new_bb->GetLabelInst(), new_bb.get());
  def_use_mgr->AnalyzeInstDefUse(new_bb->GetLabelInst());

  BasicBlock* bb_pred = cfg.block(cfg.preds(bb->id())[0]);
  bb_pred->tail()->ForEachInId([bb, &new_bb](uint32_t* id) {
    if (*id == bb->id()) {
      *id = new_bb->id();
    }
  });
  cfg.RemoveEdge(bb_pred->id(), bb->id());
  cfg.AddEdge(bb_pred->id(), new_bb->id());
  def_use_mgr->AnalyzeInstUse(&*bb_pred->tail());

  // Update the incoming branch.
  bb->ForEachPhiInst([&new_bb, def_use_mgr](Instruction* phi) {
    phi->SetInOperand(1, {new_bb->id()});
    def_use_mgr->AnalyzeInstUse(phi);
  });
  InstructionBuilder(
      context_, new_bb.get(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping)
      .AddBranch(bb->id());
  cfg.RegisterBlock(new_bb.get());

  // Add the basic block to the function.
  Function::iterator it = loop_utils_.GetFunction()->FindBlock(bb->id());
  assert(it != loop_utils_.GetFunction()->end() &&
         "Basic block not found in the function.");
  BasicBlock* ret = new_bb.get();
  loop_utils_.GetFunction()->AddBasicBlock(std::move(new_bb), it);
  return ret;
}